

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufCollectTfiCone(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  p->vTfCone->nSize = 0;
  Abc_NtkIncrementTravId(p->pNtk);
  Abc_BufCollectTfiCone_rec(pObj,p->vTfCone);
  return;
}

Assistant:

void Abc_BufCollectTfiCone( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Vec_IntClear( p->vTfCone );
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_BufCollectTfiCone_rec( pObj, p->vTfCone );
}